

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_controller.cpp
# Opt level: O3

void __thiscall
so_5::stats::impl::std_controller_t::std_controller_t(std_controller_t *this,mbox_t *mbox)

{
  controller_t::controller_t(&this->super_controller_t);
  repository_t::repository_t(&this->super_repository_t);
  (this->super_controller_t)._vptr_controller_t = (_func_int **)&PTR_mbox_00287910;
  (this->super_repository_t)._vptr_repository_t = (_func_int **)&DAT_00287950;
  (this->m_mbox).m_obj = mbox->m_obj;
  mbox->m_obj = (abstract_message_box_t *)0x0;
  *(undefined8 *)((long)&(this->m_start_stop_lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_start_stop_lock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_start_stop_lock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->m_data_lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_data_lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_data_lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_data_lock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_data_lock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->m_start_stop_lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_start_stop_lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_start_stop_lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_start_stop_lock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_start_stop_lock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->m_data_lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_data_lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_data_lock).super___mutex_base._M_mutex + 0x10) = 0;
  std::condition_variable::condition_variable(&this->m_wake_up_cond);
  (this->m_distribution_thread)._M_t.
  super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>._M_t.
  super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
  super__Head_base<0UL,_std::thread_*,_false>._M_head_impl = (thread *)0x0;
  this->m_shutdown_initiated = false;
  this->m_head = (source_t *)0x0;
  this->m_tail = (source_t *)0x0;
  (this->m_distribution_period).__r = 2000000000;
  return;
}

Assistant:

std_controller_t::std_controller_t(
	mbox_t mbox )
	:	m_mbox( std::move( mbox ) )
	{}